

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

char * ARKodeGetReturnFlagName(long flag)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  
  pcVar1 = (char *)malloc(0x1b);
  switch(flag) {
  case 0:
    builtin_strncpy(pcVar1,"ARK_SUCCESS",0xc);
    break;
  case 1:
    uVar6._0_1_ = 'T';
    uVar6._1_1_ = 'S';
    uVar6._2_1_ = 'T';
    uVar6._3_1_ = 'O';
    uVar12._0_1_ = 'P';
    uVar12._1_1_ = '_';
    uVar12._2_1_ = 'R';
    uVar12._3_1_ = 'E';
    uVar17._0_1_ = 'T';
    uVar17._1_1_ = 'U';
    uVar17._2_1_ = 'R';
    uVar17._3_1_ = 'N';
LAB_00134f67:
    pcVar1[0] = 'A';
    pcVar1[1] = 'R';
    pcVar1[2] = 'K';
    pcVar1[3] = '_';
    *(undefined4 *)(pcVar1 + 4) = uVar6;
    *(undefined4 *)(pcVar1 + 8) = uVar12;
    *(undefined4 *)(pcVar1 + 0xc) = uVar17;
    pcVar1[0x10] = '\0';
    break;
  case 2:
    uVar7._0_1_ = 'R';
    uVar7._1_1_ = 'O';
    uVar7._2_1_ = 'O';
    uVar7._3_1_ = 'T';
    uVar13._0_1_ = '_';
    uVar13._1_1_ = 'R';
    uVar13._2_1_ = 'E';
    uVar13._3_1_ = 'T';
    uVar18._0_1_ = 'U';
    uVar18._1_1_ = 'R';
    uVar18._2_1_ = 'N';
    uVar18._3_1_ = '\0';
LAB_00134f77:
    pcVar1[0] = 'A';
    pcVar1[1] = 'R';
    pcVar1[2] = 'K';
    pcVar1[3] = '_';
    *(undefined4 *)(pcVar1 + 4) = uVar7;
    *(undefined4 *)(pcVar1 + 8) = uVar13;
    *(undefined4 *)(pcVar1 + 0xc) = uVar18;
    break;
  default:
    if (flag == 99) {
      builtin_strncpy(pcVar1,"ARK_WARNING",0xc);
      return pcVar1;
    }
  case -0x62:
  case -0x61:
  case -0x60:
  case -0x5f:
  case -0x5e:
  case -0x5d:
  case -0x5c:
  case -0x5b:
  case -0x5a:
  case -0x59:
  case -0x58:
  case -0x57:
  case -0x56:
  case -0x55:
  case -0x54:
  case -0x53:
  case -0x52:
  case -0x51:
  case -0x50:
  case -0x4f:
  case -0x4e:
  case -0x4d:
  case -0x4c:
  case -0x4b:
  case -0x4a:
  case -0x49:
  case -0x48:
  case -0x47:
  case -0x46:
  case -0x45:
  case -0x44:
  case -0x43:
  case -0x42:
  case -0x41:
  case -0x40:
  case -0x3f:
  case -0x3e:
  case -0x3d:
  case -0x3c:
  case -0x3b:
  case -0x3a:
  case -0x39:
  case -0x38:
  case -0x37:
  case -0x36:
  case -0x35:
  case -0x34:
  case -0x33:
  case -0x32:
  case -0x31:
    builtin_strncpy(pcVar1,"NONE",5);
    return pcVar1;
  case -99:
    builtin_strncpy(pcVar1,"ARK_UNRECOGNIZED_ERROR",0x17);
    break;
  case -0x30:
    builtin_strncpy(pcVar1,"ARK_STEPPER_UNSUPPORTED",0x18);
    break;
  case -0x2f:
    builtin_strncpy(pcVar1,"ARK_CONTROLLER_ERR",0x13);
    break;
  case -0x2e:
    uVar4._0_1_ = 'R';
    uVar4._1_1_ = 'E';
    uVar4._2_1_ = 'L';
    uVar4._3_1_ = 'A';
    uVar10._0_1_ = 'X';
    uVar10._1_1_ = '_';
    uVar10._2_1_ = 'J';
    uVar10._3_1_ = 'A';
    uVar15._0_1_ = 'C';
    uVar15._1_1_ = '_';
    uVar15._2_1_ = 'F';
    uVar15._3_1_ = 'A';
    goto LAB_00134efa;
  case -0x2d:
    builtin_strncpy(pcVar1,"ARK_RELAX_FUNC_FAIL",0x14);
    break;
  case -0x2c:
    builtin_strncpy(pcVar1,"ARK_RELAX_MEM_NULL",0x13);
    break;
  case -0x2b:
    builtin_strncpy(pcVar1 + 7,"AX_FAIL",8);
    uVar2 = 0x414c45525f4b5241;
    goto LAB_00134fe7;
  case -0x2a:
    uVar7._0_1_ = 'C';
    uVar7._1_1_ = 'O';
    uVar7._2_1_ = 'N';
    uVar7._3_1_ = 'T';
    uVar13._0_1_ = 'E';
    uVar13._1_1_ = 'X';
    uVar13._2_1_ = 'T';
    uVar13._3_1_ = '_';
    uVar18._0_1_ = 'E';
    uVar18._1_1_ = 'R';
    uVar18._2_1_ = 'R';
    uVar18._3_1_ = '\0';
    goto LAB_00134f77;
  case -0x29:
    builtin_strncpy(pcVar1,"ARK_INVALID_TABLE",0x12);
    break;
  case -0x28:
    uVar7._0_1_ = 'I';
    uVar7._1_1_ = 'N';
    uVar7._2_1_ = 'T';
    uVar7._3_1_ = 'E';
    uVar13._0_1_ = 'R';
    uVar13._1_1_ = 'P';
    uVar13._2_1_ = '_';
    uVar13._3_1_ = 'F';
    uVar18._0_1_ = 'A';
    uVar18._1_1_ = 'I';
    uVar18._2_1_ = 'L';
    uVar18._3_1_ = '\0';
    goto LAB_00134f77;
  case -0x27:
    builtin_strncpy(pcVar1,"ARK_USER_PREDICT",0x10);
    uVar2 = 0x4c4941465f5443;
    goto LAB_00134f1d;
  case -0x26:
    builtin_strncpy(pcVar1 + 0xb,"CESS_STAGE_FAIL",0x10);
    uVar7._0_1_ = 'P';
    uVar7._1_1_ = 'O';
    uVar7._2_1_ = 'S';
    uVar7._3_1_ = 'T';
    uVar13._0_1_ = 'P';
    uVar13._1_1_ = 'R';
    uVar13._2_1_ = 'O';
    uVar13._3_1_ = 'C';
    uVar18._0_1_ = 'E';
    uVar18._1_1_ = 'S';
    uVar18._2_1_ = 'S';
    uVar18._3_1_ = '_';
    goto LAB_00134f77;
  case -0x25:
    builtin_strncpy(pcVar1 + 10,"OCESS_STEP_FAIL",0x10);
    uVar7._0_1_ = 'P';
    uVar7._1_1_ = 'O';
    uVar7._2_1_ = 'S';
    uVar7._3_1_ = 'T';
    uVar13._0_1_ = 'P';
    uVar13._1_1_ = 'R';
    uVar13._2_1_ = 'O';
    uVar13._3_1_ = 'C';
    uVar18._0_1_ = 'E';
    uVar18._1_1_ = 'S';
    uVar18._2_1_ = 'S';
    uVar18._3_1_ = '_';
    goto LAB_00134f77;
  case -0x24:
    uVar5._0_1_ = 'I';
    uVar5._1_1_ = 'N';
    uVar5._2_1_ = 'N';
    uVar5._3_1_ = 'E';
    uVar11._0_1_ = 'R';
    uVar11._1_1_ = 'T';
    uVar11._2_1_ = 'O';
    uVar11._3_1_ = 'O';
    uVar16._0_1_ = 'U';
    uVar16._1_1_ = 'T';
    uVar16._2_1_ = 'E';
    uVar16._3_1_ = 'R';
    goto LAB_00134f10;
  case -0x23:
    uVar5._0_1_ = 'O';
    uVar5._1_1_ = 'U';
    uVar5._2_1_ = 'T';
    uVar5._3_1_ = 'E';
    uVar11._0_1_ = 'R';
    uVar11._1_1_ = 'T';
    uVar11._2_1_ = 'O';
    uVar11._3_1_ = 'I';
    uVar16._0_1_ = 'N';
    uVar16._1_1_ = 'N';
    uVar16._2_1_ = 'E';
    uVar16._3_1_ = 'R';
LAB_00134f10:
    pcVar1[0] = 'A';
    pcVar1[1] = 'R';
    pcVar1[2] = 'K';
    pcVar1[3] = '_';
    *(undefined4 *)(pcVar1 + 4) = uVar5;
    *(undefined4 *)(pcVar1 + 8) = uVar11;
    *(undefined4 *)(pcVar1 + 0xc) = uVar16;
    uVar2 = 0x4c4941465f5245;
    goto LAB_00134f1d;
  case -0x22:
    uVar4._0_1_ = 'I';
    uVar4._1_1_ = 'N';
    uVar4._2_1_ = 'N';
    uVar4._3_1_ = 'E';
    uVar10._0_1_ = 'R';
    uVar10._1_1_ = 'S';
    uVar10._2_1_ = 'T';
    uVar10._3_1_ = 'E';
    uVar15._0_1_ = 'P';
    uVar15._1_1_ = '_';
    uVar15._2_1_ = 'F';
    uVar15._3_1_ = 'A';
    goto LAB_00134efa;
  case -0x21:
    builtin_strncpy(pcVar1 + 9,"STEP_ATTACH_ERR",0x10);
    uVar7._0_1_ = 'I';
    uVar7._1_1_ = 'N';
    uVar7._2_1_ = 'N';
    uVar7._3_1_ = 'E';
    uVar13._0_1_ = 'R';
    uVar13._1_1_ = 'S';
    uVar13._2_1_ = 'T';
    uVar13._3_1_ = 'E';
    uVar18._0_1_ = 'P';
    uVar18._1_1_ = '_';
    uVar18._2_1_ = 'A';
    uVar18._3_1_ = 'T';
    goto LAB_00134f77;
  case -0x20:
    builtin_strncpy(pcVar1 + 7,"_OP_ERR",8);
    uVar2 = 0x5f534c4e5f4b5241;
    goto LAB_00134fe7;
  case -0x1f:
    builtin_strncpy(pcVar1,"ARK_NLS_SETUP_RECVR",0x14);
    break;
  case -0x1e:
    uVar4._0_1_ = 'N';
    uVar4._1_1_ = 'L';
    uVar4._2_1_ = 'S';
    uVar4._3_1_ = '_';
    uVar10._0_1_ = 'S';
    uVar10._1_1_ = 'E';
    uVar10._2_1_ = 'T';
    uVar10._3_1_ = 'U';
    uVar15._0_1_ = 'P';
    uVar15._1_1_ = '_';
    uVar15._2_1_ = 'F';
    uVar15._3_1_ = 'A';
    goto LAB_00134efa;
  case -0x1d:
    uVar8._0_1_ = 'N';
    uVar8._1_1_ = 'L';
    uVar8._2_1_ = 'S';
    uVar8._3_1_ = '_';
    uVar14._0_1_ = 'I';
    uVar14._1_1_ = 'N';
    uVar14._2_1_ = 'I';
    uVar14._3_1_ = 'T';
    goto LAB_00134fc4;
  case -0x1c:
    uVar6._0_1_ = 'V';
    uVar6._1_1_ = 'E';
    uVar6._2_1_ = 'C';
    uVar6._3_1_ = 'T';
    uVar12._0_1_ = 'O';
    uVar12._1_1_ = 'R';
    uVar12._2_1_ = 'O';
    uVar12._3_1_ = 'P';
    uVar17._0_1_ = '_';
    uVar17._1_1_ = 'E';
    uVar17._2_1_ = 'R';
    uVar17._3_1_ = 'R';
    goto LAB_00134f67;
  case -0x1b:
    builtin_strncpy(pcVar1 + 6,"O_CLOSE",8);
    uVar2 = 0x5f4f4f545f4b5241;
    goto LAB_00134fe7;
  case -0x1a:
    builtin_strncpy(pcVar1,"ARK_BAD_DKY",0xc);
    break;
  case -0x19:
    builtin_strncpy(pcVar1,"ARK_BAD_T",10);
    break;
  case -0x18:
    builtin_strncpy(pcVar1,"ARK_BAD_K",10);
    break;
  case -0x17:
    builtin_strncpy(pcVar1 + 6,"_MALLOC",8);
    uVar2 = 0x4d5f4f4e5f4b5241;
    goto LAB_00134fe7;
  case -0x16:
    builtin_strncpy(pcVar1 + 6,"L_INPUT",8);
    uVar2 = 0x5f4c4c495f4b5241;
    goto LAB_00134fe7;
  case -0x15:
    uVar2 = 0x4c4c554e5f4d45;
    goto LAB_00134f86;
  case -0x14:
    uVar2 = 0x4c4941465f4d45;
LAB_00134f86:
    *(undefined8 *)(pcVar1 + 5) = uVar2;
    uVar2 = 0x5f4d454d5f4b5241;
    goto LAB_00134fe7;
  case -0x13:
    uVar7._0_1_ = 'C';
    uVar7._1_1_ = 'O';
    uVar7._2_1_ = 'N';
    uVar7._3_1_ = 'S';
    uVar13._0_1_ = 'T';
    uVar13._1_1_ = 'R';
    uVar13._2_1_ = '_';
    uVar13._3_1_ = 'F';
    uVar18._0_1_ = 'A';
    uVar18._1_1_ = 'I';
    uVar18._2_1_ = 'L';
    uVar18._3_1_ = '\0';
    goto LAB_00134f77;
  case -0x12:
    uVar8._0_1_ = 'M';
    uVar8._1_1_ = 'A';
    uVar8._2_1_ = 'S';
    uVar8._3_1_ = 'S';
    uVar14._0_1_ = 'M';
    uVar14._1_1_ = 'U';
    uVar14._2_1_ = 'L';
    uVar14._3_1_ = 'T';
    goto LAB_00134fc4;
  case -0x11:
    uVar8._0_1_ = 'M';
    uVar8._1_1_ = 'A';
    uVar8._2_1_ = 'S';
    uVar8._3_1_ = 'S';
    uVar14._0_1_ = 'F';
    uVar14._1_1_ = 'R';
    uVar14._2_1_ = 'E';
    uVar14._3_1_ = 'E';
    goto LAB_00134fc4;
  case -0x10:
    uVar4._0_1_ = 'M';
    uVar4._1_1_ = 'A';
    uVar4._2_1_ = 'S';
    uVar4._3_1_ = 'S';
    uVar10._0_1_ = 'S';
    uVar10._1_1_ = 'O';
    uVar10._2_1_ = 'L';
    uVar10._3_1_ = 'V';
    uVar15._0_1_ = 'E';
    uVar15._1_1_ = '_';
    uVar15._2_1_ = 'F';
    uVar15._3_1_ = 'A';
    goto LAB_00134efa;
  case -0xf:
    uVar4._0_1_ = 'M';
    uVar4._1_1_ = 'A';
    uVar4._2_1_ = 'S';
    uVar4._3_1_ = 'S';
    uVar10._0_1_ = 'S';
    uVar10._1_1_ = 'E';
    uVar10._2_1_ = 'T';
    uVar10._3_1_ = 'U';
    uVar15._0_1_ = 'P';
    uVar15._1_1_ = '_';
    uVar15._2_1_ = 'F';
    uVar15._3_1_ = 'A';
LAB_00134efa:
    pcVar1[0] = 'A';
    pcVar1[1] = 'R';
    pcVar1[2] = 'K';
    pcVar1[3] = '_';
    *(undefined4 *)(pcVar1 + 4) = uVar4;
    *(undefined4 *)(pcVar1 + 8) = uVar10;
    *(undefined4 *)(pcVar1 + 0xc) = uVar15;
    pcVar1[0xf] = 'A';
    pcVar1[0x10] = 'I';
    pcVar1[0x11] = 'L';
    pcVar1[0x12] = '\0';
    break;
  case -0xe:
    uVar8._0_1_ = 'M';
    uVar8._1_1_ = 'A';
    uVar8._2_1_ = 'S';
    uVar8._3_1_ = 'S';
    uVar14._0_1_ = 'I';
    uVar14._1_1_ = 'N';
    uVar14._2_1_ = 'I';
    uVar14._3_1_ = 'T';
LAB_00134fc4:
    pcVar1[0] = 'A';
    pcVar1[1] = 'R';
    pcVar1[2] = 'K';
    pcVar1[3] = '_';
    *(undefined4 *)(pcVar1 + 4) = uVar8;
    *(undefined4 *)(pcVar1 + 8) = uVar14;
    pcVar1[0xc] = '_';
    pcVar1[0xd] = 'F';
    pcVar1[0xe] = 'A';
    pcVar1[0xf] = 'I';
    pcVar1[0x10] = 'L';
    pcVar1[0x11] = '\0';
    break;
  case -0xd:
    builtin_strncpy(pcVar1 + 7,"EE_FAIL",8);
    uVar2 = 0x4552464c5f4b5241;
    goto LAB_00134fe7;
  case -0xc:
    uVar7._0_1_ = 'R';
    uVar7._1_1_ = 'T';
    uVar7._2_1_ = 'F';
    uVar7._3_1_ = 'U';
    uVar13._0_1_ = 'N';
    uVar13._1_1_ = 'C';
    uVar13._2_1_ = '_';
    uVar13._3_1_ = 'F';
    uVar18._0_1_ = 'A';
    uVar18._1_1_ = 'I';
    uVar18._2_1_ = 'L';
    uVar18._3_1_ = '\0';
    goto LAB_00134f77;
  case -0xb:
    uVar3._0_1_ = 'U';
    uVar3._1_1_ = 'N';
    uVar3._2_1_ = 'R';
    uVar3._3_1_ = 'E';
    uVar9._0_1_ = 'C';
    uVar9._1_1_ = '_';
    uVar9._2_1_ = 'R';
    uVar9._3_1_ = 'H';
    goto LAB_00134dea;
  case -10:
    uVar3._0_1_ = 'R';
    uVar3._1_1_ = 'E';
    uVar3._2_1_ = 'P';
    uVar3._3_1_ = 'T';
    uVar9._0_1_ = 'D';
    uVar9._1_1_ = '_';
    uVar9._2_1_ = 'R';
    uVar9._3_1_ = 'H';
    goto LAB_00134dea;
  case -9:
    uVar3._0_1_ = 'F';
    uVar3._1_1_ = 'I';
    uVar3._2_1_ = 'R';
    uVar3._3_1_ = 'S';
    uVar9._0_1_ = 'T';
    uVar9._1_1_ = '_';
    uVar9._2_1_ = 'R';
    uVar9._3_1_ = 'H';
LAB_00134dea:
    pcVar1[0] = 'A';
    pcVar1[1] = 'R';
    pcVar1[2] = 'K';
    pcVar1[3] = '_';
    *(undefined4 *)(pcVar1 + 4) = uVar3;
    *(undefined4 *)(pcVar1 + 8) = uVar9;
    pcVar1[0xc] = 'S';
    pcVar1[0xd] = 'F';
    pcVar1[0xe] = 'U';
    pcVar1[0xf] = 'N';
    uVar2 = 0x5252455f434e55;
LAB_00134f1d:
    *(undefined8 *)(pcVar1 + 0xe) = uVar2;
    break;
  case -8:
    uVar6._0_1_ = 'R';
    uVar6._1_1_ = 'H';
    uVar6._2_1_ = 'S';
    uVar6._3_1_ = 'F';
    uVar12._0_1_ = 'U';
    uVar12._1_1_ = 'N';
    uVar12._2_1_ = 'C';
    uVar12._3_1_ = '_';
    uVar17._0_1_ = 'F';
    uVar17._1_1_ = 'A';
    uVar17._2_1_ = 'I';
    uVar17._3_1_ = 'L';
    goto LAB_00134f67;
  case -7:
    uVar7._0_1_ = 'L';
    uVar7._1_1_ = 'S';
    uVar7._2_1_ = 'O';
    uVar7._3_1_ = 'L';
    uVar13._0_1_ = 'V';
    uVar13._1_1_ = 'E';
    uVar13._2_1_ = '_';
    uVar13._3_1_ = 'F';
    uVar18._0_1_ = 'A';
    uVar18._1_1_ = 'I';
    uVar18._2_1_ = 'L';
    uVar18._3_1_ = '\0';
    goto LAB_00134f77;
  case -6:
    uVar7._0_1_ = 'L';
    uVar7._1_1_ = 'S';
    uVar7._2_1_ = 'E';
    uVar7._3_1_ = 'T';
    uVar13._0_1_ = 'U';
    uVar13._1_1_ = 'P';
    uVar13._2_1_ = '_';
    uVar13._3_1_ = 'F';
    uVar18._0_1_ = 'A';
    uVar18._1_1_ = 'I';
    uVar18._2_1_ = 'L';
    uVar18._3_1_ = '\0';
    goto LAB_00134f77;
  case -5:
    builtin_strncpy(pcVar1 + 7,"IT_FAIL",8);
    uVar2 = 0x494e494c5f4b5241;
LAB_00134fe7:
    *(undefined8 *)pcVar1 = uVar2;
    break;
  case -4:
    uVar6._0_1_ = 'C';
    uVar6._1_1_ = 'O';
    uVar6._2_1_ = 'N';
    uVar6._3_1_ = 'V';
    uVar12._0_1_ = '_';
    uVar12._1_1_ = 'F';
    uVar12._2_1_ = 'A';
    uVar12._3_1_ = 'I';
    uVar17._0_1_ = 'L';
    uVar17._1_1_ = 'U';
    uVar17._2_1_ = 'R';
    uVar17._3_1_ = 'E';
    goto LAB_00134f67;
  case -3:
    uVar7._0_1_ = 'E';
    uVar7._1_1_ = 'R';
    uVar7._2_1_ = 'R';
    uVar7._3_1_ = '_';
    uVar13._0_1_ = 'F';
    uVar13._1_1_ = 'A';
    uVar13._2_1_ = 'I';
    uVar13._3_1_ = 'L';
    uVar18._0_1_ = 'U';
    uVar18._1_1_ = 'R';
    uVar18._2_1_ = 'E';
    uVar18._3_1_ = '\0';
    goto LAB_00134f77;
  case -2:
    uVar6._0_1_ = 'T';
    uVar6._1_1_ = 'O';
    uVar6._2_1_ = 'O';
    uVar6._3_1_ = '_';
    uVar12._0_1_ = 'M';
    uVar12._1_1_ = 'U';
    uVar12._2_1_ = 'C';
    uVar12._3_1_ = 'H';
    uVar17._0_1_ = '_';
    uVar17._1_1_ = 'A';
    uVar17._2_1_ = 'C';
    uVar17._3_1_ = 'C';
    goto LAB_00134f67;
  case -1:
    builtin_strncpy(pcVar1,"ARK_TOO_MUCH_WORK",0x12);
  }
  return pcVar1;
}

Assistant:

char* ARKodeGetReturnFlagName(long int flag)
{
  char* name;
  name = (char*)malloc(27 * sizeof(char));

  switch (flag)
  {
  case ARK_SUCCESS: sprintf(name, "ARK_SUCCESS"); break;
  case ARK_TSTOP_RETURN: sprintf(name, "ARK_TSTOP_RETURN"); break;
  case ARK_ROOT_RETURN: sprintf(name, "ARK_ROOT_RETURN"); break;
  case ARK_WARNING: sprintf(name, "ARK_WARNING"); break;
  case ARK_TOO_MUCH_WORK: sprintf(name, "ARK_TOO_MUCH_WORK"); break;
  case ARK_TOO_MUCH_ACC: sprintf(name, "ARK_TOO_MUCH_ACC"); break;
  case ARK_ERR_FAILURE: sprintf(name, "ARK_ERR_FAILURE"); break;
  case ARK_CONV_FAILURE: sprintf(name, "ARK_CONV_FAILURE"); break;
  case ARK_LINIT_FAIL: sprintf(name, "ARK_LINIT_FAIL"); break;
  case ARK_LSETUP_FAIL: sprintf(name, "ARK_LSETUP_FAIL"); break;
  case ARK_LSOLVE_FAIL: sprintf(name, "ARK_LSOLVE_FAIL"); break;
  case ARK_RHSFUNC_FAIL: sprintf(name, "ARK_RHSFUNC_FAIL"); break;
  case ARK_FIRST_RHSFUNC_ERR: sprintf(name, "ARK_FIRST_RHSFUNC_ERR"); break;
  case ARK_REPTD_RHSFUNC_ERR: sprintf(name, "ARK_REPTD_RHSFUNC_ERR"); break;
  case ARK_UNREC_RHSFUNC_ERR: sprintf(name, "ARK_UNREC_RHSFUNC_ERR"); break;
  case ARK_RTFUNC_FAIL: sprintf(name, "ARK_RTFUNC_FAIL"); break;
  case ARK_LFREE_FAIL: sprintf(name, "ARK_LFREE_FAIL"); break;
  case ARK_MASSINIT_FAIL: sprintf(name, "ARK_MASSINIT_FAIL"); break;
  case ARK_MASSSETUP_FAIL: sprintf(name, "ARK_MASSSETUP_FAIL"); break;
  case ARK_MASSSOLVE_FAIL: sprintf(name, "ARK_MASSSOLVE_FAIL"); break;
  case ARK_MASSFREE_FAIL: sprintf(name, "ARK_MASSFREE_FAIL"); break;
  case ARK_MASSMULT_FAIL: sprintf(name, "ARK_MASSMULT_FAIL"); break;
  case ARK_CONSTR_FAIL: sprintf(name, "ARK_CONSTR_FAIL"); break;
  case ARK_MEM_FAIL: sprintf(name, "ARK_MEM_FAIL"); break;
  case ARK_MEM_NULL: sprintf(name, "ARK_MEM_NULL"); break;
  case ARK_ILL_INPUT: sprintf(name, "ARK_ILL_INPUT"); break;
  case ARK_NO_MALLOC: sprintf(name, "ARK_NO_MALLOC"); break;
  case ARK_BAD_K: sprintf(name, "ARK_BAD_K"); break;
  case ARK_BAD_T: sprintf(name, "ARK_BAD_T"); break;
  case ARK_BAD_DKY: sprintf(name, "ARK_BAD_DKY"); break;
  case ARK_TOO_CLOSE: sprintf(name, "ARK_TOO_CLOSE"); break;
  case ARK_VECTOROP_ERR: sprintf(name, "ARK_VECTOROP_ERR"); break;
  case ARK_NLS_INIT_FAIL: sprintf(name, "ARK_NLS_INIT_FAIL"); break;
  case ARK_NLS_SETUP_FAIL: sprintf(name, "ARK_NLS_SETUP_FAIL"); break;
  case ARK_NLS_SETUP_RECVR: sprintf(name, "ARK_NLS_SETUP_RECVR"); break;
  case ARK_NLS_OP_ERR: sprintf(name, "ARK_NLS_OP_ERR"); break;
  case ARK_INNERSTEP_ATTACH_ERR:
    sprintf(name, "ARK_INNERSTEP_ATTACH_ERR");
    break;
  case ARK_INNERSTEP_FAIL: sprintf(name, "ARK_INNERSTEP_FAIL"); break;
  case ARK_OUTERTOINNER_FAIL: sprintf(name, "ARK_OUTERTOINNER_FAIL"); break;
  case ARK_INNERTOOUTER_FAIL: sprintf(name, "ARK_INNERTOOUTER_FAIL"); break;
  case ARK_POSTPROCESS_STEP_FAIL:
    sprintf(name, "ARK_POSTPROCESS_STEP_FAIL");
    break;
  case ARK_POSTPROCESS_STAGE_FAIL:
    sprintf(name, "ARK_POSTPROCESS_STAGE_FAIL");
    break;
  case ARK_USER_PREDICT_FAIL: sprintf(name, "ARK_USER_PREDICT_FAIL"); break;
  case ARK_INTERP_FAIL: sprintf(name, "ARK_INTERP_FAIL"); break;
  case ARK_INVALID_TABLE: sprintf(name, "ARK_INVALID_TABLE"); break;
  case ARK_CONTEXT_ERR: sprintf(name, "ARK_CONTEXT_ERR"); break;
  case ARK_RELAX_FAIL: sprintf(name, "ARK_RELAX_FAIL"); break;
  case ARK_RELAX_MEM_NULL: sprintf(name, "ARK_RELAX_MEM_NULL"); break;
  case ARK_RELAX_FUNC_FAIL: sprintf(name, "ARK_RELAX_FUNC_FAIL"); break;
  case ARK_RELAX_JAC_FAIL: sprintf(name, "ARK_RELAX_JAC_FAIL"); break;
  case ARK_CONTROLLER_ERR: sprintf(name, "ARK_CONTROLLER_ERR"); break;
  case ARK_STEPPER_UNSUPPORTED: sprintf(name, "ARK_STEPPER_UNSUPPORTED"); break;
  case ARK_UNRECOGNIZED_ERROR: sprintf(name, "ARK_UNRECOGNIZED_ERROR"); break;
  default: sprintf(name, "NONE");
  }

  return (name);
}